

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O3

void __thiscall
rsg::BinaryOp<8,_(rsg::Associativity)0>::~BinaryOp(BinaryOp<8,_(rsg::Associativity)0> *this)

{
  pointer pSVar1;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__BinaryOp_007882c8;
  if (this->m_leftValueExpr != (Expression *)0x0) {
    (*this->m_leftValueExpr->_vptr_Expression[1])();
  }
  if (this->m_rightValueExpr != (Expression *)0x0) {
    (*this->m_rightValueExpr->_vptr_Expression[1])();
  }
  ValueRange::~ValueRange(&this->m_rightValueRange);
  ValueRange::~ValueRange(&this->m_leftValueRange);
  pSVar1 = (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pSVar1 != (pointer)0x0) {
    operator_delete(pSVar1,(long)(this->m_value).m_value.
                                 super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar1);
  }
  VariableType::~VariableType(&this->m_type);
  Expression::~Expression(&this->super_Expression);
  return;
}

Assistant:

BinaryOp<Precedence, Assoc>::~BinaryOp (void)
{
	delete m_leftValueExpr;
	delete m_rightValueExpr;
}